

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

int get_old(char *dir,FileName *varray,char *afile,char *vfile)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  FileName *centry;
  char ver [16];
  char vbuf [16];
  int highest_p;
  char vless [4096];
  char to_file [4096];
  char name [4096];
  
  if (varray->version_no == 0xffffffff) {
    return 0;
  }
  strcpy(name,afile);
  separate_version(name,ver,1);
  iVar1 = get_versionless(varray,vless,dir);
  pcVar3 = dir;
  pcVar6 = dir;
  if (iVar1 == 0) {
    if (ver[0] == '\0') {
      for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar3, *pcVar6 != '\0'));
          pcVar6 = pcVar6 + 1) {
        pcVar3 = pcVar7;
      }
    }
    else {
      uVar2 = strtoul(ver,(char **)0x0,10);
      while( true ) {
        if (varray->version_no == 0xffffffff) {
          return 0;
        }
        if (varray->version_no == (uint)uVar2) break;
        varray = varray + 1;
      }
      for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar3, *pcVar6 != '\0'));
          pcVar6 = pcVar6 + 1) {
        pcVar3 = pcVar7;
      }
    }
  }
  else {
    if ((varray->version_no == 0) && (varray[1].version_no == 0xffffffff)) {
      if (ver[0] == '\0') {
        strcpy(vfile,vless);
        sVar4 = strlen(vfile);
        (vfile + sVar4)[0] = '.';
        (vfile + sVar4)[1] = '~';
        vfile[sVar4 + 2] = '\0';
        sVar4 = strlen(vfile);
        (vfile + sVar4)[0] = '1';
        (vfile + sVar4)[1] = '\0';
        sVar4 = strlen(vfile);
        (vfile + sVar4)[0] = '~';
        (vfile + sVar4)[1] = '\0';
        goto LAB_00116feb;
      }
      uVar2 = strtoul(ver,(char **)0x0,10);
      if ((int)uVar2 != 1) {
        return 0;
      }
      strcpy(afile,name);
      sVar4 = strlen(afile);
      (afile + sVar4)[0] = '.';
      (afile + sVar4)[1] = '~';
      afile[sVar4 + 2] = '\0';
      sVar4 = strlen(afile);
      (afile + sVar4)[0] = '1';
      (afile + sVar4)[1] = '\0';
      sVar4 = strlen(afile);
      (afile + sVar4)[0] = '~';
      (afile + sVar4)[1] = '\0';
      for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar3, *pcVar6 != '\0'));
          pcVar6 = pcVar6 + 1) {
        pcVar3 = pcVar7;
      }
      if (pcVar6 + -1 == pcVar3) {
        if (pcVar3 == dir) {
          vfile[0] = '/';
          vfile[1] = '\0';
        }
        else {
          strcpy(vfile,dir);
        }
      }
      else {
        strcpy(vfile,dir);
        sVar4 = strlen(vfile);
        (vfile + sVar4)[0] = '/';
        (vfile + sVar4)[1] = '\0';
      }
      strcat(vfile,afile);
      pcVar3 = vless;
      vfile = afile;
      goto LAB_00117091;
    }
    iVar1 = check_vless_link(vless,varray,to_file,&highest_p);
    if (iVar1 == 0) {
      return 0;
    }
    if (to_file[0] == '\0') {
      if (ver[0] == '\0') {
        uVar2 = (ulong)(varray->version_no + 1);
      }
      else {
        uVar2 = strtoul(ver,(char **)0x0,10);
        uVar5 = varray->version_no;
        if (uVar5 + 1 != (uint)uVar2) {
          while( true ) {
            if (uVar5 == 0xffffffff) {
              return 0;
            }
            if (uVar5 == (uint)uVar2) break;
            uVar5 = varray[1].version_no;
            varray = varray + 1;
          }
          for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar3, *pcVar6 != '\0'));
              pcVar6 = pcVar6 + 1) {
            pcVar3 = pcVar7;
          }
          goto LAB_00117044;
        }
        uVar2 = uVar2 & 0xffffffff;
      }
      sprintf(vbuf,"%u",uVar2);
      strcpy(vfile,vless);
      if (vbuf[0] != '\0') {
        sVar4 = strlen(vfile);
        (vfile + sVar4)[0] = '.';
        (vfile + sVar4)[1] = '~';
        vfile[sVar4 + 2] = '\0';
        strcat(vfile,vbuf);
        sVar4 = strlen(vfile);
        (vfile + sVar4)[0] = '~';
        (vfile + sVar4)[1] = '\0';
      }
LAB_00116feb:
      strcpy(afile,vless);
      return 1;
    }
    if (ver[0] == '\0') {
      for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar3, *pcVar6 != '\0'));
          pcVar6 = pcVar6 + 1) {
        pcVar3 = pcVar7;
      }
    }
    else {
      uVar2 = strtoul(ver,(char **)0x0,10);
      while( true ) {
        if (varray->version_no == 0xffffffff) {
          return 0;
        }
        if (varray->version_no == (uint)uVar2) break;
        varray = varray + 1;
      }
      for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar3, *pcVar6 != '\0'));
          pcVar6 = pcVar6 + 1) {
        pcVar3 = pcVar7;
      }
    }
  }
LAB_00117044:
  if (pcVar6 + -1 == pcVar3) {
    if (pcVar3 == dir) {
      afile[0] = '/';
      afile[1] = '\0';
    }
    else {
      strcpy(afile,dir);
    }
  }
  else {
    strcpy(afile,dir);
    sVar4 = strlen(afile);
    (afile + sVar4)[0] = '/';
    (afile + sVar4)[1] = '\0';
  }
  strcat(afile,varray->name);
  pcVar3 = afile;
LAB_00117091:
  strcpy(vfile,pcVar3);
  return 1;
}

Assistant:

static int get_old(char *dir, FileName *varray, char *afile, char *vfile)
{
  char name[MAXPATHLEN], vless[MAXPATHLEN], to_file[MAXPATHLEN];
  char ver[VERSIONLEN], vbuf[VERSIONLEN];
  unsigned ver_no, max_no;
  int highest_p;
  FileName *entry;

  /* "Old" file have to be existing, thus varray should not be empty. */
  if (NoFileP(varray)) return (0);

  strcpy(name, afile);
  separate_version(name, ver, 1);

  if (get_versionless(varray, vless, dir) == 0) {
    /*
     * There is no versionless file, but at least one versioned
     * file exists.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The highest versioned file
       * is an old file.
       */
      FindHighestVersion(varray, entry, max_no);
      ConcDirAndName(dir, entry->name, afile);
      strcpy(vfile, afile);
      return (1);
    } else {
      /*
       * A version is specified.  We have to walk thorough
       * varray and try to find the file with the specified
       * version.
       */
      ver_no = strtoul(ver, (char **)NULL, 10);
      FindSpecifiedVersion(varray, entry, ver_no);
      if (entry != NULL) {
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      } else
        return (0);
    }
  } else if (OnlyVersionlessP(varray)) {
    /*
     * There is only versionless file in varray.
     * If the specified version is 1 the versionless file is regarded
     * as version 1 file.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The versionless file is dealt
       * with as version 1.
       */
      ConcNameAndVersion(vless, "1", vfile);
      strcpy(afile, vless);
      return (1);
    } else {
      ver_no = strtoul(ver, (char **)NULL, 10);
      if (ver_no == 1) {
        /*
         * Version 1 is specified.  The versionless file is
         * dealt with as a version 1 file.
         */
        ConcNameAndVersion(name, "1", afile);
        ConcDirAndName(dir, afile, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /*
         * Other versions than 1 are not recognized as an old
         * file.
         */
        return (0);
      }
    }
  } else {
    if (check_vless_link(vless, varray, to_file, &highest_p) == 0) return (0);
    if (*to_file == '\0') {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is not linked
       * to any file in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The one higher than an
         * existing maximum version is dealt with as the
         * old version, and it should be a version of the
         * link missing versionless file.
         */
        FindHighestVersion(varray, entry, max_no);
        sprintf(vbuf, "%u", max_no + 1);
        ConcNameAndVersion(vless, vbuf, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /* A version is specified. */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindHighestVersion(varray, entry, max_no);
        if (ver_no == max_no + 1) {
          /*
           * If the version is one higher than the
           * existing highest version is specified, it
           * is dealt with as a version of the link
           * missing versionless file.
           */
          sprintf(vbuf, "%u", ver_no);
          ConcNameAndVersion(vless, vbuf, vfile);
          strcpy(afile, vless);
          return (1);
        } else {
          /*
           * We have to walk through varray and try
           * to find the file with the specified version.
           */
          FindSpecifiedVersion(varray, entry, ver_no);
          if (entry != NULL) {
            ConcDirAndName(dir, entry->name, afile);
            strcpy(vfile, afile);
            return (1);
          } else
            return (0);
        }
      }
    } else {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is linked to
       * one of files in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The highest versioned file
         * in varray is an old file.
         */
        FindHighestVersion(varray, entry, max_no);
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      } else {
        /*
         * A version is specified.  We have to walk thorough
         * varray and try to find the file with the specified
         * version.
         */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindSpecifiedVersion(varray, entry, ver_no);
        if (entry != NULL) {
          ConcDirAndName(dir, entry->name, afile);
          strcpy(vfile, afile);
          return (1);
        } else
          return (0);
      }
    }
  }
}